

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall BasicBlock::UnlinkSucc(BasicBlock *this,BasicBlock *block,bool doCleanPred)

{
  code *pcVar1;
  bool bVar2;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Type *ppFVar3;
  BasicBlock *pBVar4;
  undefined4 *puVar5;
  FlowEdge **edge;
  EditingIterator iter;
  bool doCleanPred_local;
  BasicBlock *block_local;
  BasicBlock *this_local;
  
  iter.last._7_1_ = doCleanPred;
  this_00 = &GetSuccList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&edge,this_00);
  do {
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)&edge);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xccd,"((0))","Edge not found.");
      if (bVar2) {
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    ppFVar3 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&edge);
    pBVar4 = FlowEdge::GetSucc(*ppFVar3);
  } while (pBVar4 != block);
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::UnlinkCurrent
            ((EditingIterator *)&edge);
  if ((iter.last._7_1_ & 1) != 0) {
    UnlinkPred(block,this,false);
  }
  return;
}

Assistant:

void
BasicBlock::UnlinkSucc(BasicBlock *block, bool doCleanPred)
{
    FOREACH_SLISTBASECOUNTED_ENTRY_EDITING(FlowEdge*, edge, this->GetSuccList(), iter)
    {
        if (edge->GetSucc() == block)
        {
            iter.UnlinkCurrent();
            if (doCleanPred)
            {
                block->UnlinkPred(this, false);
            }
            return;
        }
    } NEXT_SLISTBASECOUNTED_ENTRY_EDITING;
    AssertMsg(UNREACHED, "Edge not found.");
}